

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O3

_Bool square_allowsfeel(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  square *psVar2;
  
  _Var1 = square_ispassable(c,grid);
  if ((_Var1) && (_Var1 = square_isdamaging(c,grid), !_Var1)) {
    psVar2 = square(c,grid);
    _Var1 = flag_has_dbg(f_info[psVar2->feat].flags,6,0x28,"f_info[feat].flags","TF_FALL");
    return !_Var1;
  }
  return false;
}

Assistant:

bool square_allowsfeel(struct chunk *c, struct loc grid) {
	return square_ispassable(c, grid) && !square_isdamaging(c, grid) &&
		!square_isfall(c, grid);
}